

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall
happly::TypedProperty<short>::writeHeader(TypedProperty<short> *this,ostream *outStream)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = std::operator<<((ostream *)outStream,"property ");
  typeName<short>();
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_Property).name);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

virtual void writeHeader(std::ostream& outStream) override {
    outStream << "property " << typeName<T>() << " " << name << "\n";
  }